

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::Bootstrap::opers_arithmetic_pod(ModulePtr *m)

{
  element_type *this;
  element_type *name;
  string *in_stack_fffffffffffff6e0;
  Proxy_Function *in_stack_fffffffffffff6e8;
  allocator *f;
  Module *in_stack_fffffffffffff6f0;
  allocator local_711;
  string local_710 [55];
  allocator local_6d9;
  string local_6d8 [55];
  allocator local_6a1;
  string local_6a0 [55];
  allocator local_669;
  string local_668 [55];
  allocator local_631;
  string local_630 [55];
  allocator local_5f9;
  string local_5f8 [55];
  allocator local_5c1;
  string local_5c0 [55];
  allocator local_589;
  string local_588 [55];
  allocator local_551;
  string local_550 [55];
  allocator local_519;
  string local_518 [55];
  allocator local_4e1;
  string local_4e0 [55];
  allocator local_4a9;
  string local_4a8 [55];
  allocator local_471;
  string local_470 [55];
  allocator local_439;
  string local_438 [55];
  allocator local_401;
  string local_400 [55];
  allocator local_3c9;
  string local_3c8 [55];
  allocator local_391;
  string local_390 [55];
  allocator local_359;
  string local_358 [55];
  allocator local_321;
  string local_320 [55];
  allocator local_2e9;
  string local_2e8 [55];
  allocator local_2b1;
  string local_2b0 [55];
  allocator local_279;
  string local_278 [55];
  allocator local_241;
  string local_240 [55];
  allocator local_209;
  string local_208 [55];
  allocator local_1d1;
  string local_1d0 [55];
  allocator local_199;
  string local_198 [55];
  allocator local_161;
  string local_160 [55];
  allocator local_129;
  string local_128 [55];
  allocator local_f1;
  string local_f0 [55];
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [71];
  allocator local_39;
  string local_38 [56];
  
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f29c);
  fun<bool,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_bool_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"==",&local_39);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f331);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f33e);
  fun<bool,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_bool_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"<",&local_81);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f3d3);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f3e0);
  fun<bool,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_bool_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,">",&local_b9);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f475);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f482);
  fun<bool,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_bool_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,">=",&local_f1);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f517);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f524);
  fun<bool,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_bool_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"<=",&local_129);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f5b9);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f5c6);
  fun<bool,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_bool_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"!=",&local_161);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f65b);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f668);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number>
            ((_func_Boxed_Number_Boxed_Number *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"--",&local_199);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f6fd);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f70a);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number>
            ((_func_Boxed_Number_Boxed_Number *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"++",&local_1d1);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f79f);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f7ac);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"+",&local_209);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f841);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f84e);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"+",&local_241);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f8e3);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f8f0);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"-",&local_279);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35f985);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35f992);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"-",&local_2b1);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fa27);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fa34);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"&=",&local_2e9);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fac9);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fad6);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"=",&local_321);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fb6b);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fb78);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"|=",&local_359);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fc0d);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fc1a);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"^=",&local_391);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fcaf);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fcbc);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"%=",&local_3c9);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fd51);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fd5e);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"<<=",&local_401);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fdf3);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fe00);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,">>=",&local_439);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35fe95);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35fea2);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"&",&local_471);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35ff37);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35ff44);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"~",&local_4a9);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35ffd9);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35ffe6);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"^",&local_4e1);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x36007b);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x360088);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"|",&local_519);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x36011d);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x36012a);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"*=",&local_551);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3601bf);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3601cc);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"/=",&local_589);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x36025b);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x360268);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"+=",&local_5c1);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3602f1);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3602fe);
  fun<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f8,"-=",&local_5f9);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x360387);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x360394);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"/",&local_631);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x36041d);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x36042a);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"<<",&local_669);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3604b3);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3604c0);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"*",&local_6a1);
  Module::add(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x360549);
  this = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x360556);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"%",&local_6d9);
  Module::add(this,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3605df);
  name = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x3605ec);
  fun<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *)in_stack_fffffffffffff6e8);
  f = &local_711;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_710,">>",f);
  Module::add(this,(Proxy_Function *)f,(string *)name);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x360675);
  return;
}

Assistant:

static void opers_arithmetic_pod(ModulePtr m = std::make_shared<Module>())
      {
        m->add(fun(&Boxed_Number::equals), "==");
        m->add(fun(&Boxed_Number::less_than), "<");
        m->add(fun(&Boxed_Number::greater_than), ">");
        m->add(fun(&Boxed_Number::greater_than_equal), ">=");
        m->add(fun(&Boxed_Number::less_than_equal), "<=");
        m->add(fun(&Boxed_Number::not_equal), "!=");

        m->add(fun(&Boxed_Number::pre_decrement), "--");
        m->add(fun(&Boxed_Number::pre_increment), "++");
        m->add(fun(&Boxed_Number::sum), "+");
        m->add(fun(&Boxed_Number::unary_plus), "+");
        m->add(fun(&Boxed_Number::unary_minus), "-");
        m->add(fun(&Boxed_Number::difference), "-");
        m->add(fun(&Boxed_Number::assign_bitwise_and), "&=");
        m->add(fun(&Boxed_Number::assign), "=");
        m->add(fun(&Boxed_Number::assign_bitwise_or), "|=");
        m->add(fun(&Boxed_Number::assign_bitwise_xor), "^=");
        m->add(fun(&Boxed_Number::assign_remainder), "%=");
        m->add(fun(&Boxed_Number::assign_shift_left), "<<=");
        m->add(fun(&Boxed_Number::assign_shift_right), ">>=");
        m->add(fun(&Boxed_Number::bitwise_and), "&");
        m->add(fun(&Boxed_Number::bitwise_complement), "~");
        m->add(fun(&Boxed_Number::bitwise_xor), "^");
        m->add(fun(&Boxed_Number::bitwise_or), "|");
        m->add(fun(&Boxed_Number::assign_product), "*=");
        m->add(fun(&Boxed_Number::assign_quotient), "/=");
        m->add(fun(&Boxed_Number::assign_sum), "+=");
        m->add(fun(&Boxed_Number::assign_difference), "-=");
        m->add(fun(&Boxed_Number::quotient), "/");
        m->add(fun(&Boxed_Number::shift_left), "<<");
        m->add(fun(&Boxed_Number::product), "*");
        m->add(fun(&Boxed_Number::remainder), "%");
        m->add(fun(&Boxed_Number::shift_right), ">>");


     }